

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereLoopAddBtreeIndex
              (WhereLoopBuilder *pBuilder,SrcList_item *pSrc,Index *pProbe,LogEst nInMul)

{
  byte *pbVar1;
  ushort uVar2;
  ushort uVar3;
  WhereLoop *p;
  Parse *pParse;
  u32 serial_type;
  SrcList_item *pSrc_00;
  WhereTerm *pWVar4;
  Parse *pParse_00;
  sqlite3 *psVar5;
  u32 uVar6;
  byte bVar7;
  LogEst nRet;
  LogEst LVar8;
  short sVar9;
  LogEst LVar10;
  int iVar11;
  u32 uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  WhereTerm *pWVar16;
  char *pcVar17;
  undefined4 extraout_var;
  anon_union_8_3_737c4e49_for_u aVar18;
  undefined4 extraout_var_00;
  ushort uVar19;
  short sVar20;
  short sVar21;
  u32 uVar22;
  undefined6 in_register_0000000a;
  undefined8 uVar23;
  anon_union_8_3_737c4e49_for_u aVar24;
  uchar *puVar25;
  ulong uVar26;
  ulong uVar27;
  u64 x;
  Index *v;
  WhereTerm *pWVar28;
  Select *aStat;
  WhereLoopBuilder *pWVar29;
  WhereTerm *pWVar30;
  long lVar31;
  uint uVar32;
  Expr *pEVar33;
  u8 uVar34;
  int n;
  tRowcnt nOut;
  tRowcnt a [2];
  WhereScan scan;
  u32 local_1a8;
  ushort local_1a4;
  u16 local_1a2;
  WhereTerm *local_1a0;
  undefined1 local_198 [24];
  undefined1 local_180 [24];
  ulong local_168;
  SrcList_item *local_160;
  anon_union_8_3_737c4e49_for_u local_158;
  WhereTerm *local_150;
  Parse *local_148;
  Select *local_140;
  uchar *local_138;
  undefined8 local_130;
  undefined8 local_128;
  uint local_120;
  ushort local_11a;
  WhereLoopBuilder *local_118;
  Index *local_110;
  ulong local_108;
  int local_fc;
  sqlite3 *local_f8;
  undefined8 local_f0;
  Expr *local_e8;
  int local_dc;
  int local_d8;
  u32 local_d4;
  long local_d0;
  CollSeq *local_c8;
  ulong local_c0;
  ulong local_b8;
  u64 local_b0;
  Bitmask local_a8;
  WhereScan local_a0;
  
  local_f0 = CONCAT62(in_register_0000000a,nInMul);
  local_148 = pBuilder->pWInfo->pParse;
  local_f8 = local_148->db;
  iVar15 = 7;
  if (local_f8->mallocFailed == '\0') {
    p = pBuilder->pNew;
    local_120 = p->wsFlags;
    uVar13 = 0x18;
    if ((local_120 & 0x20) == 0) {
      uVar13 = 0x1bf;
    }
    uVar32 = uVar13 & 0xffffff83;
    if ((*(ushort *)&pProbe->field_0x63 & 4) == 0) {
      uVar32 = uVar13;
    }
    pWVar28 = (WhereTerm *)(ulong)uVar32;
    local_1a4 = (p->u).btree.nEq;
    local_198._8_8_ = ZEXT28(local_1a4);
    local_180._14_2_ = (p->u).btree.nBtm;
    local_180._12_2_ = (p->u).btree.nTop;
    local_11a = p->nSkip;
    local_1a2 = p->nLTerm;
    local_a8 = p->prereq;
    local_180._8_4_ = ZEXT24((ushort)p->nOut);
    local_160 = pSrc;
    pWVar16 = whereScanInit(&local_a0,pBuilder->pWC,pSrc->iCursor,(uint)local_1a4,uVar32,pProbe);
    p->rSetup = 0;
    local_b0 = (u64)*pProbe->aiRowLogEst;
    sVar21 = 0;
    if (10 < (long)local_b0) {
      LVar8 = sqlite3LogEst(local_b0);
      sVar21 = LVar8 + -0x21;
    }
    local_c0 = (ulong)local_1a2;
    iVar15 = 0;
    if (pWVar16 != (WhereTerm *)0x0) {
      local_dc = local_1a2 + 1;
      local_b8 = (ulong)(uint)(int)sVar21;
      local_1a0 = (WhereTerm *)0x0;
      local_150 = (WhereTerm *)0x0;
      do {
        uVar2 = pWVar16->eOperator;
        iVar11 = pBuilder->nRecValid;
        if ((uVar2 == 0x100) || ((pWVar16->wtFlags & 0x80) != 0)) {
          sVar21 = pProbe->aiColumn[local_198._8_8_];
          if ((long)sVar21 < 0) {
            uVar34 = sVar21 == -1;
          }
          else {
            uVar34 = pProbe->pTable->aCol[sVar21].notNull;
          }
          if (uVar34 == '\0') goto LAB_0019ba1c;
LAB_0019ba14:
          iVar15 = 0;
        }
        else {
LAB_0019ba1c:
          iVar15 = 0;
          if ((((pWVar16->prereqRight & p->maskSelf) == 0) &&
              ((uVar2 != 0x10 || ((pWVar16->wtFlags & 0x100) == 0)))) &&
             ((((local_160->fg).jointype & 8) == 0 || (iVar15 = 0, (pWVar16->pExpr->flags & 1) != 0)
              ))) {
            if (pProbe->onError == '\0') {
LAB_0019ba79:
              uVar13 = 1;
            }
            else {
              uVar13 = 2;
              if (pProbe->nKeyCol - 1 != local_198._8_4_) goto LAB_0019ba79;
            }
            pBuilder->bldFlags = pBuilder->bldFlags | uVar13;
            p->wsFlags = local_120;
            (p->u).btree.nEq = local_1a4;
            (p->u).btree.nBtm = local_180._14_2_;
            (p->u).btree.nTop = local_180._12_2_;
            p->nLTerm = local_1a2;
            local_d8 = iVar11;
            iVar11 = whereLoopResize(local_f8,p,local_dc);
            iVar15 = 0;
            if (iVar11 != 0) break;
            uVar3 = p->nLTerm;
            uVar19 = uVar3 + 1;
            p->nLTerm = uVar19;
            p->aLTerm[uVar3] = pWVar16;
            p->prereq = ~p->maskSelf & (pWVar16->prereqRight | local_a8);
            if ((uVar2 & 1) == 0) {
              if ((uVar2 & 0x82) == 0) {
                if ((uVar2 >> 8 & 1) == 0) {
                  pWVar28 = pWVar16;
                  if ((uVar2 & 0x24) == 0) {
                    p->wsFlags = p->wsFlags | 0x12;
                    iVar15 = whereRangeVectorLen(local_148,local_160->iCursor,pProbe,local_198._8_4_
                                                 ,pWVar16);
                    (p->u).btree.nTop = (u16)iVar15;
                    uVar12 = p->wsFlags;
                    if ((uVar12 & 0x20) == 0) {
                      local_150 = (WhereTerm *)0x0;
                    }
                    else {
                      local_150 = p->aLTerm[(ulong)p->nLTerm - 2];
                    }
                    pWVar29 = (WhereLoopBuilder *)0x0;
                    local_1a0 = pWVar16;
                  }
                  else {
                    p->wsFlags = p->wsFlags | 0x22;
                    iVar15 = whereRangeVectorLen(local_148,local_160->iCursor,pProbe,local_198._8_4_
                                                 ,pWVar16);
                    (p->u).btree.nBtm = (u16)iVar15;
                    if ((pWVar16->wtFlags & 0x100) == 0) {
                      uVar12 = p->wsFlags;
                      pWVar29 = (WhereLoopBuilder *)0x0;
                      local_1a0 = (WhereTerm *)0x0;
                      local_150 = pWVar16;
                    }
                    else {
                      iVar11 = whereLoopResize(local_f8,p,p->nLTerm + 1);
                      iVar15 = 0;
                      if (iVar11 != 0) break;
                      uVar3 = p->nLTerm;
                      p->nLTerm = uVar3 + 1;
                      p->aLTerm[uVar3] = pWVar16 + 1;
                      uVar12 = p->wsFlags | 0x10;
                      p->wsFlags = uVar12;
                      (p->u).btree.nTop = 1;
                      pWVar29 = (WhereLoopBuilder *)0x0;
                      local_1a0 = pWVar16 + 1;
                      local_150 = pWVar16;
                    }
                  }
                }
                else {
                  uVar12 = p->wsFlags | 8;
                  p->wsFlags = uVar12;
LAB_0019bd10:
                  pWVar29 = (WhereLoopBuilder *)0x0;
                }
              }
              else {
                sVar21 = pProbe->aiColumn[local_198._8_8_];
                uVar13 = p->wsFlags;
                uVar12 = uVar13 | 1;
                p->wsFlags = uVar12;
                if (sVar21 == -1) {
LAB_0019bb94:
                  uVar12 = uVar13 | 0x1001;
                }
                else {
                  pWVar29 = (WhereLoopBuilder *)0x0;
                  if (((short)local_f0 != 0) || (sVar21 < 0)) goto LAB_0019bd13;
                  if (pProbe->nKeyCol - 1 != local_198._8_4_) goto LAB_0019bd10;
                  if (((pProbe->field_0x63 & 8) != 0) ||
                     (((pProbe->nKeyCol == 1 && (uVar2 == 2)) && (pProbe->onError != '\0'))))
                  goto LAB_0019bb94;
                  uVar12 = uVar13 | 0x10001;
                }
                p->wsFlags = uVar12;
                pWVar29 = (WhereLoopBuilder *)0x0;
              }
            }
            else {
              pEVar33 = pWVar16->pExpr;
              if ((pEVar33->flags & 0x800) == 0) {
                pWVar29 = (WhereLoopBuilder *)0x0;
                if (((pEVar33->x).pList != (ExprList *)0x0) &&
                   (x = (u64)((pEVar33->x).pList)->nExpr, x != 0)) {
                  LVar8 = sqlite3LogEst(x);
                  pWVar29 = (WhereLoopBuilder *)(ulong)(uint)(int)LVar8;
                }
LAB_0019bc08:
                if ((pProbe->field_0x63 & 0x80) != 0) {
                  sVar21 = pProbe->aiRowLogEst[local_198._8_8_];
                  iVar15 = 0;
                  if (10 < (int)pWVar29) {
LAB_0019bcb6:
                    local_118 = pBuilder;
                    LVar8 = sqlite3LogEst((ulong)pWVar29 & 0xffff);
                    iVar15 = (int)(short)(LVar8 + -0x21);
                    pBuilder = local_118;
                  }
                  if (iVar15 + sVar21 + 10 < (int)local_b8 + (int)pWVar29) goto LAB_0019ba14;
                }
              }
              else {
                if (1 < uVar19) {
                  pWVar29 = (WhereLoopBuilder *)0x2e;
                  uVar27 = 0;
                  pWVar28 = (WhereTerm *)0x0;
                  do {
                    if ((p->aLTerm[uVar27] != (WhereTerm *)0x0) &&
                       (p->aLTerm[uVar27]->pExpr == pEVar33)) {
                      pWVar29 = (WhereLoopBuilder *)0x0;
                    }
                    uVar27 = uVar27 + 1;
                  } while (uVar19 - 1 != uVar27);
                  goto LAB_0019bc08;
                }
                pWVar29 = (WhereLoopBuilder *)0x2e;
                if ((pProbe->field_0x63 & 0x80) != 0) {
                  sVar21 = pProbe->aiRowLogEst[local_198._8_8_];
                  pWVar29 = (WhereLoopBuilder *)0x2e;
                  goto LAB_0019bcb6;
                }
              }
              uVar12 = p->wsFlags | 4;
              p->wsFlags = uVar12;
            }
LAB_0019bd13:
            pWVar4 = local_150;
            if ((uVar12 & 2) == 0) {
              uVar13 = (p->u).vtab.idxNum + 1;
              (p->u).btree.nEq = (u16)uVar13;
              if ((pWVar16->truthProb < 1) && (-1 < pProbe->aiColumn[local_198._8_8_])) {
                p->nOut = p->nOut + (pWVar16->truthProb - (short)pWVar29);
LAB_0019be62:
                sVar21 = (short)pWVar29;
              }
              else {
                uVar13 = uVar13 & 0xffff;
                uVar27 = (ulong)uVar13;
                local_198._0_8_ = local_198._0_8_ & 0xffffffff00000000;
                if (((((short)local_f0 == 0) &&
                     ((pProbe->nSample != 0 && ((int)uVar13 <= pProbe->nSampleCol)))) &&
                    (((uVar2 & 1) == 0 || ((pWVar16->pExpr->flags & 0x800) == 0)))) &&
                   ((local_f8->dbOptFlags & 0x800) == 0)) {
                  local_168 = uVar27;
                  if ((uVar2 & 0x182) == 0) {
                    local_118 = pWVar29;
                    iVar15 = whereInScanEst(local_148,pBuilder,(pWVar16->pExpr->x).pList,
                                            (tRowcnt *)local_198);
                  }
                  else {
                    local_118 = pWVar29;
                    iVar15 = whereEqualScanEst(local_148,pBuilder,pWVar16->pExpr->pRight,
                                               (tRowcnt *)local_198);
                  }
                  if ((iVar15 != 0xc) && (iVar15 != 0)) break;
                  sVar21 = (short)local_118;
                  uVar27 = local_168;
                  pWVar29 = local_118;
                  if ((local_198._0_8_ & 0xffffffff) == 0) goto LAB_0019bd4c;
                  LVar8 = sqlite3LogEst(local_198._0_8_ & 0xffffffff);
                  sVar20 = (short)local_180._8_4_;
                  if (LVar8 < (short)local_180._8_4_) {
                    sVar20 = LVar8;
                  }
                  LVar8 = sVar20 - sVar21;
                }
                else {
LAB_0019bd4c:
                  sVar21 = (short)pWVar29;
                  sVar20 = (pProbe->aiRowLogEst[uVar27] - pProbe->aiRowLogEst[uVar27 - 1]) + p->nOut
                  ;
                  p->nOut = sVar20;
                  if ((uVar2 >> 8 & 1) == 0) goto LAB_0019bf85;
                  LVar8 = sVar20 + 10;
                }
                p->nOut = LVar8;
              }
            }
            else {
              uVar32 = (uint)p->nOut;
              uVar27 = (ulong)uVar32;
              pParse = (Parse *)(p->u).btree.pIndex;
              uVar13 = (pParse->constraintName).n;
              aVar18._4_4_ = 0;
              aVar18.leftColumn = uVar13;
              pWVar16 = local_1a0;
              pWVar30 = local_150;
              local_118 = pWVar29;
              if (0 < (int)uVar13) {
                uVar2 = (p->u).btree.nEq;
                uVar26 = (ulong)uVar2;
                if (((int)(uint)uVar2 < *(int *)&(pParse->constraintName).field_0xc) &&
                   (local_128 = local_148->db, (local_128->dbOptFlags & 0x800) == 0)) {
                  local_198._16_8_ = pParse;
                  local_168 = uVar26;
                  if (pBuilder->nRecValid == (uint)uVar2) {
                    local_198._0_8_ = pBuilder->pRec;
                    local_128._4_4_ = (undefined4)((ulong)local_128 >> 0x20);
                    local_128 = (sqlite3 *)CONCAT44(local_128._4_4_,(uint)(p->u).btree.nBtm);
                    uVar13 = (uint)(p->u).btree.nTop;
                    if ((Index *)local_198._0_8_ != (Index *)0x0) {
                      *(ushort *)&((Index *)local_198._0_8_)->aiRowLogEst = uVar2;
                    }
                    if (uVar2 == 0) {
                      local_180._16_4_ = pParse->nTableLock;
                      local_138 = (uchar *)((ulong)local_138 & 0xffffffff00000000);
                    }
                    else {
                      whereKeyStats(pParse,(Index *)local_198._0_8_,(UnpackedRecord *)0x0,
                                    (int)local_180,(tRowcnt *)pWVar28);
                      local_138 = (uchar *)CONCAT44(local_138._4_4_,local_180._0_4_);
                      local_180._16_4_ = local_180._4_4_ + local_180._0_4_;
                    }
                    local_180._20_4_ = 0;
                    pWVar16 = pWVar4;
                    pWVar30 = local_1a0;
                    if (*(char *)(*(long *)(local_198._16_8_ + 0x38) + local_168) == '\0') {
                      uVar32 = (uint)local_128;
                      local_128 = (sqlite3 *)CONCAT44(local_128._4_4_,uVar13);
                      pWVar16 = local_1a0;
                      pWVar30 = pWVar4;
                      uVar13 = uVar32;
                    }
                    if (pWVar30 == (WhereTerm *)0x0) {
                      uVar23 = 0;
                      iVar15 = -2;
                      pWVar30 = (WhereTerm *)0x0;
                    }
                    else {
                      local_140 = (Select *)pWVar30->pExpr->pRight;
                      iVar11 = sqlite3Stat4ProbeSetValue
                                         (local_148,(Index *)local_198._16_8_,
                                          (UnpackedRecord **)local_198,(Expr *)local_140,uVar13,
                                          (int)local_168,(int *)&local_1a8);
                      iVar15 = -2;
                      uVar23 = CONCAT44(extraout_var,iVar11);
                      if (local_1a8 != 0 && iVar11 == 0) {
                        uVar34 = *(u8 *)&local_140->pEList;
                        if (uVar34 == 0xa8) {
                          uVar34 = *(u8 *)((long)&local_140->pWhere + 6);
                        }
                        if (uVar34 == 0x83) {
                          aStat = ((anon_union_8_2_a01b6dbf_for_x *)(local_140->addrOpenEphm + 1))->
                                  pSelect;
LAB_0019c756:
                          iVar15 = aStat->pEList->nExpr;
                        }
                        else {
                          iVar15 = 1;
                          aStat = local_140;
                          if (uVar34 == 0xa9) {
                            aStat = (Select *)(local_140->addrOpenEphm + 1);
                            goto LAB_0019c756;
                          }
                        }
                        uVar13 = 0xc;
                        if ((int)local_1a8 < iVar15) {
                          uVar13 = 0x18;
                        }
                        local_130 = CONCAT44(extraout_var,iVar11);
                        local_108 = uVar27;
                        iVar15 = whereKeyStats((Parse *)local_198._16_8_,(Index *)local_198._0_8_,
                                               (UnpackedRecord *)0x0,(int)local_180,(tRowcnt *)aStat
                                              );
                        uVar13 = pWVar30->eOperator & uVar13;
                        if (uVar13 != 0) {
                          uVar13 = local_180._4_4_;
                        }
                        uVar32 = (uint)local_138;
                        if ((uint)local_138 < uVar13 + local_180._0_4_) {
                          uVar32 = uVar13 + local_180._0_4_;
                        }
                        local_138 = (uchar *)CONCAT44(local_138._4_4_,uVar32);
                        uVar27 = (ulong)((int)local_108 - 1);
                        pWVar30 = (WhereTerm *)0x0;
                        uVar23 = local_130;
                      }
                    }
                    local_140 = (Select *)CONCAT44(local_140._4_4_,iVar15);
                    if (pWVar16 == (WhereTerm *)0x0) {
                      pWVar16 = (WhereTerm *)0x0;
LAB_0019c865:
                      iVar15 = (int)uVar23;
                      pWVar28 = (WhereTerm *)0xffffffff;
                      uVar13 = (uint)local_180._16_8_;
                    }
                    else {
                      local_158 = (anon_union_8_3_737c4e49_for_u)pWVar16->pExpr->pRight;
                      iVar15 = sqlite3Stat4ProbeSetValue
                                         (local_148,(Index *)local_198._16_8_,
                                          (UnpackedRecord **)local_198,(Expr *)local_158.pOrInfo,
                                          (uint)local_128,(int)local_168,(int *)&local_1a8);
                      uVar23 = CONCAT44(extraout_var_00,iVar15);
                      if (local_1a8 == 0 || iVar15 != 0) goto LAB_0019c865;
                      uVar34 = *(u8 *)&((local_158.pOrInfo)->wc).pWInfo;
                      if (uVar34 == 0xa8) {
                        uVar34 = *(u8 *)((long)&((local_158.pOrInfo)->wc).aStatic[0].pWC + 6);
                      }
                      if (uVar34 == 0x83) {
                        aVar18 = (anon_union_8_3_737c4e49_for_u)
                                 ((anon_union_8_2_a01b6dbf_for_x *)&((local_158.pOrInfo)->wc).a)->
                                 pSelect;
LAB_0019c875:
                        iVar15 = *(int *)&(((aVar18.pOrInfo)->wc).pWInfo)->pParse;
                      }
                      else {
                        iVar15 = 1;
                        aVar18 = local_158;
                        if (uVar34 == 0xa9) {
                          aVar18.pOrInfo = (WhereOrInfo *)&((local_158.pOrInfo)->wc).a;
                          goto LAB_0019c875;
                        }
                      }
                      uVar32 = 0xc;
                      if ((int)local_1a8 < iVar15) {
                        uVar32 = 0x18;
                      }
                      local_130 = uVar23;
                      local_108 = uVar27;
                      uVar13 = whereKeyStats((Parse *)local_198._16_8_,(Index *)local_198._0_8_,
                                             (UnpackedRecord *)0x1,(int)local_180,
                                             (tRowcnt *)aVar18.pOrInfo);
                      pWVar28 = (WhereTerm *)(ulong)uVar13;
                      uVar32 = pWVar16->eOperator & uVar32;
                      if (uVar32 != 0) {
                        uVar32 = local_180._4_4_;
                      }
                      uVar13 = uVar32 + local_180._0_4_;
                      if ((uint)local_180._16_8_ <= uVar32 + local_180._0_4_) {
                        uVar13 = (uint)local_180._16_8_;
                      }
                      uVar27 = (ulong)((int)local_108 - 1);
                      pWVar16 = (WhereTerm *)0x0;
                      iVar15 = (int)local_130;
                    }
                    uVar32 = (uint)uVar27;
                    pBuilder->pRec = (UnpackedRecord *)local_198._0_8_;
                    if (iVar15 == 0) {
                      uVar14 = 10;
                      if ((uint)local_138 <= uVar13 && uVar13 - (uint)local_138 != 0) {
                        local_168 = CONCAT44(local_168._4_4_,(int)pWVar28);
                        LVar8 = sqlite3LogEst((ulong)(uVar13 - (uint)local_138));
                        sVar21 = LVar8 + -0x14;
                        if ((int)local_140 != (int)local_168) {
                          sVar21 = LVar8;
                        }
                        uVar14 = (uint)sVar21;
                      }
                      if ((int)uVar14 <= (int)uVar32) {
                        uVar32 = uVar14;
                      }
                    }
                  }
                  else {
                    lVar31._0_1_ = pParse->isMultiWrite;
                    lVar31._1_1_ = pParse->mayAbort;
                    lVar31._2_1_ = pParse->hasCompound;
                    lVar31._3_1_ = pParse->okConstFactor;
                    lVar31._4_1_ = pParse->disableLookaside;
                    lVar31._5_1_ = pParse->disableVtab;
                    lVar31._6_2_ = *(undefined2 *)&pParse->field_0x26;
                    local_180._16_8_ = aVar18;
                    local_108 = uVar27;
                    if (lVar31 == 0) {
                      pcVar17 = sqlite3IndexAffinityStr(local_128,(Index *)pParse);
                      if (pcVar17 != (char *)0x0) {
                        lVar31._0_1_ = pParse->isMultiWrite;
                        lVar31._1_1_ = pParse->mayAbort;
                        lVar31._2_1_ = pParse->hasCompound;
                        lVar31._3_1_ = pParse->okConstFactor;
                        lVar31._4_1_ = pParse->disableLookaside;
                        lVar31._5_1_ = pParse->disableVtab;
                        lVar31._6_2_ = *(undefined2 *)&pParse->field_0x26;
                        goto LAB_0019c108;
                      }
                      uVar34 = 'A';
                    }
                    else {
LAB_0019c108:
                      uVar34 = *(u8 *)(lVar31 + uVar26);
                    }
                    pParse_00 = local_148;
                    iVar15 = 0;
                    local_198._0_8_ = (Index *)0x0;
                    local_180._0_8_ = (Expr *)0x0;
                    local_c8 = sqlite3LocateCollSeq
                                         (local_148,
                                          *(char **)(*(long *)&pParse->iSelfTab + uVar26 * 8));
                    if (local_150 == (WhereTerm *)0x0) {
                      local_140 = (Select *)0xffffffff;
                    }
                    else {
                      local_140 = (Select *)0x0;
                      pWVar28 = (WhereTerm *)local_198;
                      iVar15 = stat4ValueFromExpr(pParse_00,local_150->pExpr->pRight,uVar34,
                                                  (ValueNewStat4Ctx *)0x0,(sqlite3_value **)pWVar28)
                      ;
                    }
                    uVar27 = local_168;
                    aVar24.leftColumn = (int)local_180._16_8_ + 1;
                    aVar24._4_4_ = 0;
                    if ((local_1a0 == (WhereTerm *)0x0) || (iVar15 != 0)) {
LAB_0019c382:
                      pEVar33 = (Expr *)0x0;
                      v = (Index *)0x0;
                      aVar18.pOrInfo = (WhereOrInfo *)0x0;
                      if ((Index *)local_198._0_8_ != (Index *)0x0) goto LAB_0019c3a0;
                    }
                    else {
                      pWVar28 = (WhereTerm *)local_180;
                      iVar15 = stat4ValueFromExpr(local_148,local_1a0->pExpr->pRight,uVar34,
                                                  (ValueNewStat4Ctx *)0x0,(sqlite3_value **)pWVar28)
                      ;
                      if ((Expr *)local_180._0_8_ == (Expr *)0x0) {
                        aVar24._4_4_ = 0;
                        aVar24.leftColumn = ((Token *)(local_198._16_8_ + 0x60))->n;
                        goto LAB_0019c382;
                      }
                      aVar24.pOrInfo = (WhereOrInfo *)0x0;
                      pEVar33 = (Expr *)local_180._0_8_;
LAB_0019c3a0:
                      if ((iVar15 == 0) && (0 < (int)((Token *)(local_198._16_8_ + 0x60))->n)) {
                        local_168 = (ulong)((int)uVar27 + 1);
                        local_158.pOrInfo = (WhereOrInfo *)0x0;
                        lVar31 = 0;
                        local_110 = (Index *)local_198._0_8_;
                        local_e8 = pEVar33;
                        do {
                          local_138 = *(uchar **)
                                       (*(long *)(local_198._16_8_ + 0x78) + lVar31 * 0x28);
                          local_fc = *(int *)(*(long *)(local_198._16_8_ + 0x78) + 8 + lVar31 * 0x28
                                             );
                          local_1a8 = 0;
                          local_180._16_8_ = aVar24;
                          if ((char)*local_138 < '\0') {
                            bVar7 = sqlite3GetVarint32(local_138,&local_d4);
                            uVar13 = (uint)bVar7;
                            uVar12 = local_d4;
                          }
                          else {
                            uVar13 = 1;
                            uVar12 = (int)(char)*local_138;
                          }
                          uVar23 = 0x129c1;
                          if ((local_fc < (int)uVar12) ||
                             (local_d0 = lVar31, (int)uVar12 <= (int)uVar13)) {
LAB_0019c655:
                            pWVar28 = (WhereTerm *)0x20c3f2;
                            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar23)
                            ;
                            v = local_110;
                            aVar24 = (anon_union_8_3_737c4e49_for_u)local_180._16_8_;
                            pEVar33 = local_e8;
                            break;
                          }
                          uVar27 = local_168 & 0xffffffff;
                          local_130 = CONCAT44(local_130._4_4_,uVar12);
                          puVar25 = local_138;
                          uVar6 = uVar12;
                          do {
                            uVar22 = uVar6;
                            if ((char)puVar25[uVar13] < '\0') {
                              bVar7 = sqlite3GetVarint32(puVar25 + uVar13,&local_1a8);
                              uVar32 = (uint)bVar7;
                              puVar25 = local_138;
                              uVar12 = (u32)local_130;
                            }
                            else {
                              uVar32 = 1;
                              local_1a8 = (int)(char)puVar25[uVar13];
                            }
                            psVar5 = local_128;
                            serial_type = local_1a8;
                            uVar13 = uVar13 + uVar32;
                            if ((int)uVar12 < (int)uVar13) {
                              uVar23 = 0x129c7;
                              goto LAB_0019c655;
                            }
                            if ((ulong)local_1a8 < 0x80) {
                              uVar32 = (uint)""[local_1a8];
                            }
                            else {
                              uVar32 = local_1a8 - 0xc >> 1;
                            }
                            uVar14 = (int)uVar27 - 1;
                            uVar27 = (ulong)uVar14;
                            uVar6 = uVar32 + uVar22;
                          } while (uVar14 != 0);
                          if (local_fc < (int)(uVar32 + uVar22)) {
                            uVar23 = 0x129cd;
                            goto LAB_0019c655;
                          }
                          aVar18 = local_158;
                          if (local_158.pOrInfo == (WhereOrInfo *)0x0) {
                            local_130 = CONCAT44(local_130._4_4_,uVar22);
                            aVar18.pOrInfo = (WhereOrInfo *)sqlite3DbMallocZero(local_128,0x38);
                            v = local_110;
                            aVar24 = (anon_union_8_3_737c4e49_for_u)local_180._16_8_;
                            pEVar33 = local_e8;
                            if (aVar18.pOrInfo == (WhereOrInfo *)0x0) break;
                            *(undefined2 *)&((aVar18.pOrInfo)->wc).pOuter = 1;
                            ((aVar18.pOrInfo)->wc).aStatic[0].pExpr = (Expr *)psVar5;
                            puVar25 = local_138;
                            uVar22 = (u32)local_130;
                          }
                          sqlite3VdbeSerialGet
                                    (puVar25 + (int)uVar22,serial_type,(Mem *)aVar18.pOrInfo);
                          *(u8 *)((long)&((aVar18.pOrInfo)->wc).pOuter + 2) = psVar5->enc;
                          local_158 = aVar18;
                          if (local_110 != (Index *)0x0) {
                            uVar13 = sqlite3MemCompare((Mem *)local_110,(Mem *)aVar18.pOrInfo,
                                                       local_c8);
                            local_140 = (Select *)
                                        (ulong)(uint)((int)local_140 - ((int)~uVar13 >> 0x1f));
                          }
                          lVar31 = local_d0;
                          pEVar33 = local_e8;
                          aVar24 = (anon_union_8_3_737c4e49_for_u)local_180._16_8_;
                          if (local_e8 != (Expr *)0x0) {
                            uVar13 = sqlite3MemCompare((Mem *)local_e8,(Mem *)local_158.pOrInfo,
                                                       local_c8);
                            aVar24.leftColumn = (int)local_180._16_8_ - ((int)~uVar13 >> 0x1f);
                            aVar24._4_4_ = 0;
                          }
                          lVar31 = lVar31 + 1;
                          v = local_110;
                        } while (lVar31 < (int)((Token *)(local_198._16_8_ + 0x60))->n);
                      }
                      else {
                        local_158.pOrInfo = (WhereOrInfo *)0x0;
                        v = (Index *)local_198._0_8_;
                      }
                      uVar13 = aVar24.leftColumn - (int)local_140;
                      if (((local_150 == (WhereTerm *)0x0) || (local_1a0 == (WhereTerm *)0x0)) ||
                         (aVar18 = local_158, 1 < (int)uVar13)) {
                        if ((int)uVar13 < 2) {
                          uVar13 = 1;
                        }
                        local_110 = v;
                        LVar8 = sqlite3LogEst((long)(int)((Token *)(local_198._16_8_ + 0x60))->n);
                        LVar10 = sqlite3LogEst((ulong)uVar13);
                        p->nOut = p->nOut + (LVar10 - LVar8);
                        sqlite3ValueFree((sqlite3_value *)local_110);
                        sqlite3ValueFree((sqlite3_value *)pEVar33);
                        sqlite3ValueFree((sqlite3_value *)local_158.pOrInfo);
                        pWVar29 = local_118;
                        goto LAB_0019be62;
                      }
                    }
                    sqlite3ValueFree((sqlite3_value *)v);
                    sqlite3ValueFree((sqlite3_value *)pEVar33);
                    sqlite3ValueFree((sqlite3_value *)aVar18.pOrInfo);
                    pWVar16 = local_1a0;
                    pWVar30 = local_150;
                    uVar32 = (uint)local_108;
                  }
                }
              }
              uVar13 = uVar32;
              if (pWVar30 != (WhereTerm *)0x0) {
                if (pWVar30->truthProb < 1) {
                  uVar13 = (ushort)pWVar30->truthProb + uVar32;
                }
                else {
                  uVar13 = uVar32 - 0x14;
                  if ((pWVar30->wtFlags & 0x80) != 0) {
                    uVar13 = uVar32;
                  }
                }
              }
              uVar14 = uVar13;
              if (pWVar16 != (WhereTerm *)0x0) {
                if (pWVar16->truthProb < 1) {
                  uVar14 = (ushort)pWVar16->truthProb + uVar13;
                }
                else {
                  uVar14 = uVar13 - 0x14;
                  if ((pWVar16->wtFlags & 0x80) != 0) {
                    uVar14 = uVar13;
                  }
                }
              }
              uVar13 = uVar14;
              if (((pWVar30 != (WhereTerm *)0x0) && (pWVar16 != (WhereTerm *)0x0)) &&
                 ((0 < pWVar30->truthProb && (uVar13 = uVar14 - 0x14, pWVar16->truthProb < 1)))) {
                uVar13 = uVar14;
              }
              iVar15 = uVar32 + (pWVar16 == (WhereTerm *)0x0) + -2 +
                       (uint)(pWVar30 == (WhereTerm *)0x0);
              uVar32 = 10;
              if (10 < (short)uVar13) {
                uVar32 = uVar13;
              }
              LVar8 = (LogEst)iVar15;
              if ((int)(uVar32 & 0xffff) <= iVar15) {
                LVar8 = (LogEst)uVar32;
              }
              p->nOut = LVar8;
              sVar21 = (short)local_118;
            }
LAB_0019bf85:
            sVar20 = p->nOut;
            sVar9 = sqlite3LogEstAdd((LogEst)local_b8,
                                     (short)((pProbe->szIdxRow * 0xf) /
                                            (int)local_160->pTab->szTabRow) + sVar20 + 1);
            if ((p->wsFlags & 0x140) == 0) {
              sVar9 = sqlite3LogEstAdd(sVar9,sVar20 + 0x10);
            }
            sVar21 = sVar21 + (short)local_f0;
            p->rRun = sVar9 + sVar21;
            p->nOut = sVar20 + sVar21;
            whereLoopOutputAdjust(pBuilder->pWC,p,(LogEst)local_b0);
            iVar15 = whereLoopInsert(pBuilder,p);
            sVar9 = (short)local_180._8_4_;
            if ((p->wsFlags & 2) == 0) {
              sVar9 = sVar20;
            }
            p->nOut = sVar9;
            if (((p->wsFlags & 0x10) == 0) && ((p->u).btree.nEq < pProbe->nColumn)) {
              whereLoopAddBtreeIndex(pBuilder,local_160,pProbe,sVar21);
            }
            p->nOut = (LogEst)local_180._8_4_;
            pBuilder->nRecValid = local_d8;
          }
        }
        pWVar16 = whereScanNext(&local_a0);
        if ((iVar15 != 0) || (pWVar16 == (WhereTerm *)0x0)) break;
      } while( true );
    }
    uVar23 = local_f0;
    pSrc_00 = local_160;
    p->prereq = local_a8;
    (p->u).btree.nEq = local_1a4;
    (p->u).btree.nBtm = local_180._14_2_;
    (p->u).btree.nTop = local_180._12_2_;
    p->nSkip = local_11a;
    p->wsFlags = local_120;
    p->nOut = (LogEst)local_180._8_4_;
    p->nLTerm = local_1a2;
    if ((local_1a4 == local_11a) &&
       (((((int)local_198._8_8_ + 1U < (uint)pProbe->nKeyCol && ((pProbe->field_0x63 & 0x40) == 0))
         && ((local_f8->dbOptFlags & 0x4000) == 0)) &&
        ((0x29 < pProbe->aiRowLogEst[(long)((long)(WhereInfo **)local_198._8_8_ + 1)] &&
         (iVar15 = whereLoopResize(local_f8,p,(int)local_c0 + 1), iVar15 == 0)))))) {
      (p->u).btree.nEq = (p->u).btree.nEq + 1;
      uVar13._0_2_ = p->nLTerm;
      uVar13._2_2_ = p->nSkip;
      p->nLTerm = (undefined2)uVar13 + 1;
      p->nSkip = uVar13._2_2_ + 1;
      p->aLTerm[uVar13 & 0xffff] = (WhereTerm *)0x0;
      pbVar1 = (byte *)((long)&p->wsFlags + 1);
      *pbVar1 = *pbVar1 | 0x80;
      sVar21 = pProbe->aiRowLogEst[local_198._8_8_] -
               pProbe->aiRowLogEst[(long)((long)(WhereInfo **)local_198._8_8_ + 1)];
      p->nOut = p->nOut - sVar21;
      whereLoopAddBtreeIndex(pBuilder,pSrc_00,pProbe,sVar21 + (short)uVar23 + 5);
      p->nOut = (LogEst)local_180._8_4_;
      (p->u).btree.nEq = local_1a4;
      p->nSkip = local_1a4;
      p->wsFlags = local_120;
      iVar15 = 0;
    }
  }
  return iVar15;
}

Assistant:

static int whereLoopAddBtreeIndex(
  WhereLoopBuilder *pBuilder,     /* The WhereLoop factory */
  struct SrcList_item *pSrc,      /* FROM clause term being analyzed */
  Index *pProbe,                  /* An index on pSrc */
  LogEst nInMul                   /* log(Number of iterations due to IN) */
){
  WhereInfo *pWInfo = pBuilder->pWInfo;  /* WHERE analyse context */
  Parse *pParse = pWInfo->pParse;        /* Parsing context */
  sqlite3 *db = pParse->db;       /* Database connection malloc context */
  WhereLoop *pNew;                /* Template WhereLoop under construction */
  WhereTerm *pTerm;               /* A WhereTerm under consideration */
  int opMask;                     /* Valid operators for constraints */
  WhereScan scan;                 /* Iterator for WHERE terms */
  Bitmask saved_prereq;           /* Original value of pNew->prereq */
  u16 saved_nLTerm;               /* Original value of pNew->nLTerm */
  u16 saved_nEq;                  /* Original value of pNew->u.btree.nEq */
  u16 saved_nBtm;                 /* Original value of pNew->u.btree.nBtm */
  u16 saved_nTop;                 /* Original value of pNew->u.btree.nTop */
  u16 saved_nSkip;                /* Original value of pNew->nSkip */
  u32 saved_wsFlags;              /* Original value of pNew->wsFlags */
  LogEst saved_nOut;              /* Original value of pNew->nOut */
  int rc = SQLITE_OK;             /* Return code */
  LogEst rSize;                   /* Number of rows in the table */
  LogEst rLogSize;                /* Logarithm of table size */
  WhereTerm *pTop = 0, *pBtm = 0; /* Top and bottom range constraints */

  pNew = pBuilder->pNew;
  if( db->mallocFailed ) return SQLITE_NOMEM_BKPT;
  WHERETRACE(0x800, ("BEGIN %s.addBtreeIdx(%s), nEq=%d\n",
                     pProbe->pTable->zName,pProbe->zName, pNew->u.btree.nEq));

  assert( (pNew->wsFlags & WHERE_VIRTUALTABLE)==0 );
  assert( (pNew->wsFlags & WHERE_TOP_LIMIT)==0 );
  if( pNew->wsFlags & WHERE_BTM_LIMIT ){
    opMask = WO_LT|WO_LE;
  }else{
    assert( pNew->u.btree.nBtm==0 );
    opMask = WO_EQ|WO_IN|WO_GT|WO_GE|WO_LT|WO_LE|WO_ISNULL|WO_IS;
  }
  if( pProbe->bUnordered ) opMask &= ~(WO_GT|WO_GE|WO_LT|WO_LE);

  assert( pNew->u.btree.nEq<pProbe->nColumn );

  saved_nEq = pNew->u.btree.nEq;
  saved_nBtm = pNew->u.btree.nBtm;
  saved_nTop = pNew->u.btree.nTop;
  saved_nSkip = pNew->nSkip;
  saved_nLTerm = pNew->nLTerm;
  saved_wsFlags = pNew->wsFlags;
  saved_prereq = pNew->prereq;
  saved_nOut = pNew->nOut;
  pTerm = whereScanInit(&scan, pBuilder->pWC, pSrc->iCursor, saved_nEq,
                        opMask, pProbe);
  pNew->rSetup = 0;
  rSize = pProbe->aiRowLogEst[0];
  rLogSize = estLog(rSize);
  for(; rc==SQLITE_OK && pTerm!=0; pTerm = whereScanNext(&scan)){
    u16 eOp = pTerm->eOperator;   /* Shorthand for pTerm->eOperator */
    LogEst rCostIdx;
    LogEst nOutUnadjusted;        /* nOut before IN() and WHERE adjustments */
    int nIn = 0;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    int nRecValid = pBuilder->nRecValid;
#endif
    if( (eOp==WO_ISNULL || (pTerm->wtFlags&TERM_VNULL)!=0)
     && indexColumnNotNull(pProbe, saved_nEq)
    ){
      continue; /* ignore IS [NOT] NULL constraints on NOT NULL columns */
    }
    if( pTerm->prereqRight & pNew->maskSelf ) continue;

    /* Do not allow the upper bound of a LIKE optimization range constraint
    ** to mix with a lower range bound from some other source */
    if( pTerm->wtFlags & TERM_LIKEOPT && pTerm->eOperator==WO_LT ) continue;

    /* Do not allow constraints from the WHERE clause to be used by the
    ** right table of a LEFT JOIN.  Only constraints in the ON clause are
    ** allowed */
    if( (pSrc->fg.jointype & JT_LEFT)!=0
     && !ExprHasProperty(pTerm->pExpr, EP_FromJoin)
    ){
      continue;
    }

    if( IsUniqueIndex(pProbe) && saved_nEq==pProbe->nKeyCol-1 ){
      pBuilder->bldFlags |= SQLITE_BLDF_UNIQUE;
    }else{
      pBuilder->bldFlags |= SQLITE_BLDF_INDEXED;
    }
    pNew->wsFlags = saved_wsFlags;
    pNew->u.btree.nEq = saved_nEq;
    pNew->u.btree.nBtm = saved_nBtm;
    pNew->u.btree.nTop = saved_nTop;
    pNew->nLTerm = saved_nLTerm;
    if( whereLoopResize(db, pNew, pNew->nLTerm+1) ) break; /* OOM */
    pNew->aLTerm[pNew->nLTerm++] = pTerm;
    pNew->prereq = (saved_prereq | pTerm->prereqRight) & ~pNew->maskSelf;

    assert( nInMul==0
        || (pNew->wsFlags & WHERE_COLUMN_NULL)!=0 
        || (pNew->wsFlags & WHERE_COLUMN_IN)!=0 
        || (pNew->wsFlags & WHERE_SKIPSCAN)!=0 
    );

    if( eOp & WO_IN ){
      Expr *pExpr = pTerm->pExpr;
      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        /* "x IN (SELECT ...)":  TUNING: the SELECT returns 25 rows */
        int i;
        nIn = 46;  assert( 46==sqlite3LogEst(25) );

        /* The expression may actually be of the form (x, y) IN (SELECT...).
        ** In this case there is a separate term for each of (x) and (y).
        ** However, the nIn multiplier should only be applied once, not once
        ** for each such term. The following loop checks that pTerm is the
        ** first such term in use, and sets nIn back to 0 if it is not. */
        for(i=0; i<pNew->nLTerm-1; i++){
          if( pNew->aLTerm[i] && pNew->aLTerm[i]->pExpr==pExpr ) nIn = 0;
        }
      }else if( ALWAYS(pExpr->x.pList && pExpr->x.pList->nExpr) ){
        /* "x IN (value, value, ...)" */
        nIn = sqlite3LogEst(pExpr->x.pList->nExpr);
        assert( nIn>0 );  /* RHS always has 2 or more terms...  The parser
                          ** changes "x IN (?)" into "x=?". */
      }
      if( pProbe->hasStat1 ){
        LogEst M, logK, safetyMargin;
        /* Let:
        **   N = the total number of rows in the table
        **   K = the number of entries on the RHS of the IN operator
        **   M = the number of rows in the table that match terms to the 
        **       to the left in the same index.  If the IN operator is on
        **       the left-most index column, M==N.
        **
        ** Given the definitions above, it is better to omit the IN operator
        ** from the index lookup and instead do a scan of the M elements,
        ** testing each scanned row against the IN operator separately, if:
        **
        **        M*log(K) < K*log(N)
        **
        ** Our estimates for M, K, and N might be inaccurate, so we build in
        ** a safety margin of 2 (LogEst: 10) that favors using the IN operator
        ** with the index, as using an index has better worst-case behavior.
        ** If we do not have real sqlite_stat1 data, always prefer to use
        ** the index.
        */
        M = pProbe->aiRowLogEst[saved_nEq];
        logK = estLog(nIn);
        safetyMargin = 10;  /* TUNING: extra weight for indexed IN */
        if( M + logK + safetyMargin < nIn + rLogSize ){
          WHERETRACE(0x40,
            ("Scan preferred over IN operator on column %d of \"%s\" (%d<%d)\n",
             saved_nEq, pProbe->zName, M+logK+10, nIn+rLogSize));
          continue;
        }else{
          WHERETRACE(0x40,
            ("IN operator preferred on column %d of \"%s\" (%d>=%d)\n",
             saved_nEq, pProbe->zName, M+logK+10, nIn+rLogSize));
        }
      }
      pNew->wsFlags |= WHERE_COLUMN_IN;
    }else if( eOp & (WO_EQ|WO_IS) ){
      int iCol = pProbe->aiColumn[saved_nEq];
      pNew->wsFlags |= WHERE_COLUMN_EQ;
      assert( saved_nEq==pNew->u.btree.nEq );
      if( iCol==XN_ROWID 
       || (iCol>=0 && nInMul==0 && saved_nEq==pProbe->nKeyCol-1)
      ){
        if( iCol==XN_ROWID || pProbe->uniqNotNull 
         || (pProbe->nKeyCol==1 && pProbe->onError && eOp==WO_EQ) 
        ){
          pNew->wsFlags |= WHERE_ONEROW;
        }else{
          pNew->wsFlags |= WHERE_UNQ_WANTED;
        }
      }
    }else if( eOp & WO_ISNULL ){
      pNew->wsFlags |= WHERE_COLUMN_NULL;
    }else if( eOp & (WO_GT|WO_GE) ){
      testcase( eOp & WO_GT );
      testcase( eOp & WO_GE );
      pNew->wsFlags |= WHERE_COLUMN_RANGE|WHERE_BTM_LIMIT;
      pNew->u.btree.nBtm = whereRangeVectorLen(
          pParse, pSrc->iCursor, pProbe, saved_nEq, pTerm
      );
      pBtm = pTerm;
      pTop = 0;
      if( pTerm->wtFlags & TERM_LIKEOPT ){
        /* Range contraints that come from the LIKE optimization are
        ** always used in pairs. */
        pTop = &pTerm[1];
        assert( (pTop-(pTerm->pWC->a))<pTerm->pWC->nTerm );
        assert( pTop->wtFlags & TERM_LIKEOPT );
        assert( pTop->eOperator==WO_LT );
        if( whereLoopResize(db, pNew, pNew->nLTerm+1) ) break; /* OOM */
        pNew->aLTerm[pNew->nLTerm++] = pTop;
        pNew->wsFlags |= WHERE_TOP_LIMIT;
        pNew->u.btree.nTop = 1;
      }
    }else{
      assert( eOp & (WO_LT|WO_LE) );
      testcase( eOp & WO_LT );
      testcase( eOp & WO_LE );
      pNew->wsFlags |= WHERE_COLUMN_RANGE|WHERE_TOP_LIMIT;
      pNew->u.btree.nTop = whereRangeVectorLen(
          pParse, pSrc->iCursor, pProbe, saved_nEq, pTerm
      );
      pTop = pTerm;
      pBtm = (pNew->wsFlags & WHERE_BTM_LIMIT)!=0 ?
                     pNew->aLTerm[pNew->nLTerm-2] : 0;
    }

    /* At this point pNew->nOut is set to the number of rows expected to
    ** be visited by the index scan before considering term pTerm, or the
    ** values of nIn and nInMul. In other words, assuming that all 
    ** "x IN(...)" terms are replaced with "x = ?". This block updates
    ** the value of pNew->nOut to account for pTerm (but not nIn/nInMul).  */
    assert( pNew->nOut==saved_nOut );
    if( pNew->wsFlags & WHERE_COLUMN_RANGE ){
      /* Adjust nOut using stat3/stat4 data. Or, if there is no stat3/stat4
      ** data, using some other estimate.  */
      whereRangeScanEst(pParse, pBuilder, pBtm, pTop, pNew);
    }else{
      int nEq = ++pNew->u.btree.nEq;
      assert( eOp & (WO_ISNULL|WO_EQ|WO_IN|WO_IS) );

      assert( pNew->nOut==saved_nOut );
      if( pTerm->truthProb<=0 && pProbe->aiColumn[saved_nEq]>=0 ){
        assert( (eOp & WO_IN) || nIn==0 );
        testcase( eOp & WO_IN );
        pNew->nOut += pTerm->truthProb;
        pNew->nOut -= nIn;
      }else{
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
        tRowcnt nOut = 0;
        if( nInMul==0 
         && pProbe->nSample 
         && pNew->u.btree.nEq<=pProbe->nSampleCol
         && ((eOp & WO_IN)==0 || !ExprHasProperty(pTerm->pExpr, EP_xIsSelect))
         && OptimizationEnabled(db, SQLITE_Stat34)
        ){
          Expr *pExpr = pTerm->pExpr;
          if( (eOp & (WO_EQ|WO_ISNULL|WO_IS))!=0 ){
            testcase( eOp & WO_EQ );
            testcase( eOp & WO_IS );
            testcase( eOp & WO_ISNULL );
            rc = whereEqualScanEst(pParse, pBuilder, pExpr->pRight, &nOut);
          }else{
            rc = whereInScanEst(pParse, pBuilder, pExpr->x.pList, &nOut);
          }
          if( rc==SQLITE_NOTFOUND ) rc = SQLITE_OK;
          if( rc!=SQLITE_OK ) break;          /* Jump out of the pTerm loop */
          if( nOut ){
            pNew->nOut = sqlite3LogEst(nOut);
            if( pNew->nOut>saved_nOut ) pNew->nOut = saved_nOut;
            pNew->nOut -= nIn;
          }
        }
        if( nOut==0 )
#endif
        {
          pNew->nOut += (pProbe->aiRowLogEst[nEq] - pProbe->aiRowLogEst[nEq-1]);
          if( eOp & WO_ISNULL ){
            /* TUNING: If there is no likelihood() value, assume that a 
            ** "col IS NULL" expression matches twice as many rows 
            ** as (col=?). */
            pNew->nOut += 10;
          }
        }
      }
    }

    /* Set rCostIdx to the cost of visiting selected rows in index. Add
    ** it to pNew->rRun, which is currently set to the cost of the index
    ** seek only. Then, if this is a non-covering index, add the cost of
    ** visiting the rows in the main table.  */
    rCostIdx = pNew->nOut + 1 + (15*pProbe->szIdxRow)/pSrc->pTab->szTabRow;
    pNew->rRun = sqlite3LogEstAdd(rLogSize, rCostIdx);
    if( (pNew->wsFlags & (WHERE_IDX_ONLY|WHERE_IPK))==0 ){
      pNew->rRun = sqlite3LogEstAdd(pNew->rRun, pNew->nOut + 16);
    }
    ApplyCostMultiplier(pNew->rRun, pProbe->pTable->costMult);

    nOutUnadjusted = pNew->nOut;
    pNew->rRun += nInMul + nIn;
    pNew->nOut += nInMul + nIn;
    whereLoopOutputAdjust(pBuilder->pWC, pNew, rSize);
    rc = whereLoopInsert(pBuilder, pNew);

    if( pNew->wsFlags & WHERE_COLUMN_RANGE ){
      pNew->nOut = saved_nOut;
    }else{
      pNew->nOut = nOutUnadjusted;
    }

    if( (pNew->wsFlags & WHERE_TOP_LIMIT)==0
     && pNew->u.btree.nEq<pProbe->nColumn
    ){
      whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, nInMul+nIn);
    }
    pNew->nOut = saved_nOut;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    pBuilder->nRecValid = nRecValid;
#endif
  }
  pNew->prereq = saved_prereq;
  pNew->u.btree.nEq = saved_nEq;
  pNew->u.btree.nBtm = saved_nBtm;
  pNew->u.btree.nTop = saved_nTop;
  pNew->nSkip = saved_nSkip;
  pNew->wsFlags = saved_wsFlags;
  pNew->nOut = saved_nOut;
  pNew->nLTerm = saved_nLTerm;

  /* Consider using a skip-scan if there are no WHERE clause constraints
  ** available for the left-most terms of the index, and if the average
  ** number of repeats in the left-most terms is at least 18. 
  **
  ** The magic number 18 is selected on the basis that scanning 17 rows
  ** is almost always quicker than an index seek (even though if the index
  ** contains fewer than 2^17 rows we assume otherwise in other parts of
  ** the code). And, even if it is not, it should not be too much slower. 
  ** On the other hand, the extra seeks could end up being significantly
  ** more expensive.  */
  assert( 42==sqlite3LogEst(18) );
  if( saved_nEq==saved_nSkip
   && saved_nEq+1<pProbe->nKeyCol
   && pProbe->noSkipScan==0
   && OptimizationEnabled(db, SQLITE_SkipScan)
   && pProbe->aiRowLogEst[saved_nEq+1]>=42  /* TUNING: Minimum for skip-scan */
   && (rc = whereLoopResize(db, pNew, pNew->nLTerm+1))==SQLITE_OK
  ){
    LogEst nIter;
    pNew->u.btree.nEq++;
    pNew->nSkip++;
    pNew->aLTerm[pNew->nLTerm++] = 0;
    pNew->wsFlags |= WHERE_SKIPSCAN;
    nIter = pProbe->aiRowLogEst[saved_nEq] - pProbe->aiRowLogEst[saved_nEq+1];
    pNew->nOut -= nIter;
    /* TUNING:  Because uncertainties in the estimates for skip-scan queries,
    ** add a 1.375 fudge factor to make skip-scan slightly less likely. */
    nIter += 5;
    whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, nIter + nInMul);
    pNew->nOut = saved_nOut;
    pNew->u.btree.nEq = saved_nEq;
    pNew->nSkip = saved_nSkip;
    pNew->wsFlags = saved_wsFlags;
  }

  WHERETRACE(0x800, ("END %s.addBtreeIdx(%s), nEq=%d, rc=%d\n",
                      pProbe->pTable->zName, pProbe->zName, saved_nEq, rc));
  return rc;
}